

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_io.hpp
# Opt level: O0

void __thiscall
coro_io::
callback_awaitor_base<async_simple::Try<std::pair<std::error_code,unsigned_long>>,coro_io::callback_awaitor<async_simple::Try<std::pair<std::error_code,unsigned_long>>>>
::awaitor_handler::set_value<async_simple::Try<std::pair<std::error_code,unsigned_long>>>
          (awaitor_handler *this,Try<int> *args)

{
  Try<int> *in_RSI;
  Try<int> *in_stack_ffffffffffffffe8;
  
  async_simple::Try<std::pair<std::error_code,_unsigned_long>_>::operator=
            (in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void set_value(Args &&...args) const {
      if constexpr (!std::is_void_v<Arg>) {
        obj->arg_ = {std::forward<Args>(args)...};
      }
    }